

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<Replace>::copyAppend
          (QGenericArrayOps<Replace> *this,Replace *b,Replace *e)

{
  Replace *pRVar1;
  Data *pDVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    pRVar1 = (this->super_QArrayDataPointer<Replace>).ptr;
    lVar3 = (this->super_QArrayDataPointer<Replace>).size;
    do {
      pDVar2 = (b->in).d.d;
      pRVar1[lVar3].in.d.d = pDVar2;
      pRVar1[lVar3].in.d.ptr = (b->in).d.ptr;
      pRVar1[lVar3].in.d.size = (b->in).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar2 = (b->out).d.d;
      pRVar1[lVar3].out.d.d = pDVar2;
      pRVar1[lVar3].out.d.ptr = (b->out).d.ptr;
      pRVar1[lVar3].out.d.size = (b->out).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      lVar3 = (this->super_QArrayDataPointer<Replace>).size + 1;
      (this->super_QArrayDataPointer<Replace>).size = lVar3;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }